

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall
cmFileListGeneratorFixed::Search(cmFileListGeneratorFixed *this,string *parent,cmFileList *lister)

{
  bool bVar1;
  undefined1 local_40 [8];
  string fullPath;
  cmFileList *lister_local;
  string *parent_local;
  cmFileListGeneratorFixed *this_local;
  
  fullPath.field_2._8_8_ = lister;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 parent,&this->String);
  bVar1 = cmFileListGeneratorBase::Consider
                    (&this->super_cmFileListGeneratorBase,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     (cmFileList *)fullPath.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_40);
  return bVar1;
}

Assistant:

bool Search(std::string const& parent, cmFileList& lister) override
  {
    std::string fullPath = parent + this->String;
    return this->Consider(fullPath, lister);
  }